

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>const&>>,std::tuple<std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>const&>>
               (tuple<testing::Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>_>
                *matchers,
               tuple<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
               *values,ostream *os)

{
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *container;
  element_type *peVar1;
  char cVar2;
  ostream *poVar3;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
  MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
  ::Matcher((Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
             *)&MStack_1e8,
            (Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
             *)matchers);
  container = (values->
              super__Tuple_impl<0UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
              ).
              super__Head_base<0UL,_const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&,_false>
              ._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  cVar2 = (**(code **)(*(long *)MStack_1e8.impl_.
                                super___shared_ptr<const_testing::MatcherInterface<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x20))
                    (MStack_1e8.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,container,&local_1b0);
  if (cVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    peVar1 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>_>
             ).
             super__Head_base<0UL,_testing::Matcher<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>,_false>
             ._M_head_impl.
             super_MatcherBase<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x10))(peVar1,os);
    std::operator<<(os,"\n           Actual: ");
    ContainerPrinter::
    PrintValue<std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>,void>
              (container,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<const_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>_&>
  ::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }